

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O2

int __thiscall
wigwag::detail::
listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::connect(listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
          *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined4 in_register_00000034;
  listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *plVar1;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_listenable_impl_hpp:215:45)>
  sg;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_koplyarov[P]wigwag_include_wigwag_detail_listenable_impl_hpp:215:45)>
  local_40;
  anon_class_16_2_f77679f7 local_30;
  
  plVar1 = (listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
            *)CONCAT44(in_register_00000034,__fd);
  std::recursive_mutex::lock(&(plVar1->super_lock_primitive)._mutex);
  local_40._moved = false;
  local_40._f.this =
       (listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>
        *)plVar1;
  if (((__len & 1) == 0) &&
     ((plVar1->super_handler_processor<std::function<void_()>_>)._populator.super__Function_base.
      _M_manager != (_Manager_type)0x0)) {
    local_30.this = plVar1;
    local_30.handler = (handler_type *)__addr;
    connect::anon_class_16_2_f77679f7::operator()(&local_30);
  }
  listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
  ::create_node<std::function<void()>>
            ((listenable_impl<std::function<void()>,wigwag::exception_handling::none,wigwag::threading::own_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
              *)this,__fd,(function<void_()> *)(ulong)__len);
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/include/wigwag/detail/listenable_impl.hpp:215:45)>
  ::~scope_guard(&local_40);
  return (int)this;
}

Assistant:

token connect(handler_type handler, handler_attributes attributes)
        {
            get_lock_primitive().lock_nonrecursive();
            auto sg = detail::at_scope_exit([&] { get_lock_primitive().unlock_nonrecursive(); } );

            if (!contains_flag(attributes, handler_attributes::suppress_populator) && get_handler_processor().has_populate_state())
                get_exception_handler().handle_exceptions([&] { get_handler_processor().populate_state(handler); });

            return create_node(attributes, std::move(handler));
        }